

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O2

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visit(PostResolutionChecks *this,LoopStatement *loop)

{
  Expression *pEVar1;
  Constant *pCVar2;
  int64_t iVar3;
  Expression *source;
  pool_ptr<soul::AST::Expression> *this_00;
  pool_ptr<soul::AST::Constant> c;
  Type local_60;
  CompileMessage local_48;
  
  ASTVisitor::visit(&this->super_ASTVisitor,loop);
  if ((loop->numIterations).object != (Expression *)0x0) {
    this_00 = &loop->numIterations;
    pEVar1 = pool_ptr<soul::AST::Expression>::operator->(this_00);
    (*(pEVar1->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_60,pEVar1);
    if (local_60._0_8_ != 0) {
      pCVar2 = pool_ptr<soul::AST::Constant>::operator->((pool_ptr<soul::AST::Constant> *)&local_60)
      ;
      iVar3 = soul::Value::getAsInt64(&pCVar2->value);
      if (iVar3 < 1) {
        pEVar1 = pool_ptr<soul::AST::Expression>::operator->(this_00);
        Errors::negativeLoopCount<>();
        AST::Context::throwError(&(pEVar1->super_Statement).super_ASTObject.context,&local_48,false)
        ;
      }
    }
    pEVar1 = pool_ptr<soul::AST::Expression>::operator->(this_00);
    local_60.category = primitive;
    local_60.arrayElementCategory = invalid;
    local_60.isRef = false;
    local_60.isConstant = false;
    local_60.primitiveType.type = int64;
    local_60.boundingSize = 0;
    local_60.arrayElementBoundingSize = 0;
    local_60.structure.object = (Structure *)0x0;
    source = pool_ptr<soul::AST::Expression>::operator*(this_00);
    expectSilentCastPossible(&(pEVar1->super_Statement).super_ASTObject.context,&local_60,source);
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_60.structure);
  }
  return;
}

Assistant:

void visit (AST::LoopStatement& loop) override
        {
            super::visit (loop);

            if (loop.numIterations != nullptr)
            {
                if (auto c = loop.numIterations->getAsConstant())
                    if (c->value.getAsInt64() <= 0)
                        loop.numIterations->context.throwError (Errors::negativeLoopCount());

                expectSilentCastPossible (loop.numIterations->context,
                                          Type (PrimitiveType::int64), *loop.numIterations);
            }
        }